

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O2

void __thiscall
Glucose::
OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>::
cleanAll(OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
         *this)

{
  Lit *pLVar1;
  long lVar2;
  int i;
  long lVar3;
  
  lVar2 = 0;
  for (lVar3 = 0; pLVar1 = (this->dirties).data, lVar3 < (this->dirties).sz; lVar3 = lVar3 + 1) {
    if ((this->dirty).data[*(int *)((long)&pLVar1->x + lVar2)] != '\0') {
      clean(this,(Lit *)((long)&pLVar1->x + lVar2));
    }
    lVar2 = lVar2 + 4;
  }
  if (pLVar1 != (Lit *)0x0) {
    (this->dirties).sz = 0;
  }
  return;
}

Assistant:

void OccLists<Idx,Vec,Deleted>::cleanAll()
{
    for (int i = 0; i < dirties.size(); i++)
        // Dirties may contain duplicates so check here if a variable is already cleaned:
        if (dirty[toInt(dirties[i])])
            clean(dirties[i]);
    dirties.clear();
}